

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naming.cc
# Opt level: O0

string_view __thiscall
google::protobuf::compiler::rust::MultiCasePrefixStripper::StripPrefix
          (MultiCasePrefixStripper *this,string_view name)

{
  string_view sVar1;
  bool bVar2;
  ulong uVar3;
  size_type __n;
  char *pcVar4;
  string_view expected;
  undefined1 auVar5 [16];
  basic_string_view<char,_std::char_traits<char>_> local_98;
  undefined1 local_88 [16];
  MultiCasePrefixStripper *local_78;
  size_t local_70;
  undefined1 local_68 [8];
  string_view prefix;
  const_iterator __end3;
  const_iterator __begin3;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *__range3;
  string_view start_name;
  MultiCasePrefixStripper *this_local;
  string_view name_local;
  char *local_10;
  
  local_10 = name._M_str;
  this_local = (MultiCasePrefixStripper *)name._M_len;
  name_local._M_len = (size_t)local_10;
  __end3 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           ::begin(&this->prefixes_);
  prefix._M_str =
       (char *)std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
               ::end(&this->prefixes_);
  do {
    if (__end3 == (const_iterator)prefix._M_str) {
LAB_00545087:
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      name_local._M_str = (char *)name._M_len;
      if (!bVar2) {
        name_local._M_str = (char *)this_local;
        local_10 = (char *)name_local._M_len;
      }
      sVar1._M_str = local_10;
      sVar1._M_len = (size_t)name_local._M_str;
      return sVar1;
    }
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)__end3);
    pcVar4 = auVar5._8_8_;
    local_68 = auVar5._0_8_;
    local_78 = this_local;
    local_70 = name_local._M_len;
    prefix._M_len = (size_t)pcVar4;
    local_88 = auVar5;
    uVar3 = absl::lts_20240722::StartsWithIgnoreCase(this_local,name_local._M_len,local_68);
    if ((uVar3 & 1) != 0) {
      __n = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_68);
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,__n);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"_");
      expected._M_str = pcVar4;
      expected._M_len = (size_t)local_98._M_str;
      absl::lts_20240722::ConsumePrefix
                ((lts_20240722 *)&this_local,(Nonnull<absl::string_view_*>)local_98._M_len,expected)
      ;
      goto LAB_00545087;
    }
    __end3 = __end3 + 1;
  } while( true );
}

Assistant:

absl::string_view MultiCasePrefixStripper::StripPrefix(
    absl::string_view name) const {
  absl::string_view start_name = name;
  for (absl::string_view prefix : prefixes_) {
    if (absl::StartsWithIgnoreCase(name, prefix)) {
      name.remove_prefix(prefix.size());

      // Also strip a joining underscore, if present.
      absl::ConsumePrefix(&name, "_");

      // Only strip one prefix.
      break;
    }
  }

  if (name.empty()) {
    return start_name;
  }
  return name;
}